

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_flush_by_mmuidx_async_work(CPUState *cpu,run_on_cpu_data data)

{
  CPUArchState_conflict30 *env;
  int mmu_idx;
  uint i;
  uint uVar1;
  int64_t now;
  long lVar2;
  uint uVar3;
  
  env = (CPUArchState_conflict30 *)cpu->env_ptr;
  now = get_clock_realtime();
  uVar3 = data.host_int & env[-3].gpr_a[0];
  *(ushort *)env[-3].gpr_a = (ushort)env[-3].gpr_a[0] & (ushort)~uVar3;
  for (uVar1 = uVar3; (short)uVar1 != 0; uVar1 = uVar1 - 1 & uVar1) {
    mmu_idx = 0;
    if (uVar1 != 0) {
      for (; (uVar1 >> mmu_idx & 1) == 0; mmu_idx = mmu_idx + 1) {
      }
    }
    tlb_flush_one_mmuidx_locked(env,mmu_idx,now);
  }
  for (lVar2 = 0; lVar2 != 0x1000; lVar2 = lVar2 + 1) {
    cpu->tb_jmp_cache[lVar2] = (TranslationBlock *)0x0;
  }
  if ((short)uVar3 == 7) {
    *(long *)(env[-3].gpr_a + 2) = *(long *)(env[-3].gpr_a + 2) + 1;
  }
  else {
    uVar1 = uVar3 - (uVar3 >> 1 & 0x5555);
    uVar1 = (uVar1 >> 2 & 0x3333) + (uVar1 & 0x3333);
    uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f;
    *(ulong *)(env[-3].gpr_a + 4) =
         *(long *)(env[-3].gpr_a + 4) + (ulong)((uVar1 >> 8) + uVar1 & 0xff);
    if ((short)uVar3 != (short)data.host_ulong) {
      uVar1 = ~uVar3 & data.host_int;
      uVar1 = uVar1 - (uVar1 >> 1 & 0x5555);
      uVar1 = (uVar1 >> 2 & 0x3333) + (uVar1 & 0x3333);
      uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f;
      *(ulong *)(env[-3].gpr_a + 6) =
           *(long *)(env[-3].gpr_a + 6) + (ulong)((uVar1 >> 8) + uVar1 & 0xff);
    }
  }
  return;
}

Assistant:

static void tlb_flush_by_mmuidx_async_work(CPUState *cpu, run_on_cpu_data data)
{
    CPUArchState *env = cpu->env_ptr;
    uint16_t asked = data.host_int;
    uint16_t all_dirty, work, to_clean;
    int64_t now = get_clock_realtime();

    all_dirty = env_tlb(env)->c.dirty;
    to_clean = asked & all_dirty;
    all_dirty &= ~to_clean;
    env_tlb(env)->c.dirty = all_dirty;

    for (work = to_clean; work != 0; work &= work - 1) {
        int mmu_idx = ctz32(work);
        tlb_flush_one_mmuidx_locked(env, mmu_idx, now);
    }

    cpu_tb_jmp_cache_clear(cpu);

    if (to_clean == ALL_MMUIDX_BITS) {
        env_tlb(env)->c.full_flush_count = env_tlb(env)->c.full_flush_count + 1;
    } else {
        env_tlb(env)->c.part_flush_count = env_tlb(env)->c.part_flush_count + ctpop16(to_clean);
        if (to_clean != asked) {
            env_tlb(env)->c.elide_flush_count = env_tlb(env)->c.elide_flush_count + ctpop16(asked & ~to_clean);
        }
    }
}